

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void numusearray(Table *t,Counters *ct)

{
  uint uVar1;
  int iVar2;
  uint local_34;
  int local_30;
  uint lim;
  uint lc;
  uint asize;
  uint i;
  uint ause;
  uint ttlg;
  int lg;
  Counters *ct_local;
  Table *t_local;
  
  asize = 0;
  lc = 1;
  uVar1 = t->asize;
  i = 1;
  for (ause = 0; (int)ause < 0x20; ause = ause + 1) {
    local_30 = 0;
    local_34 = i;
    if ((uVar1 < i) && (local_34 = uVar1, uVar1 < lc)) break;
    for (; lc <= local_34; lc = lc + 1) {
      iVar2 = arraykeyisempty(t,lc);
      if (iVar2 == 0) {
        local_30 = local_30 + 1;
      }
    }
    ct->nums[(int)ause] = local_30 + ct->nums[(int)ause];
    asize = local_30 + asize;
    i = i << 1;
  }
  ct->total = asize + ct->total;
  ct->na = asize + ct->na;
  return;
}

Assistant:

static void numusearray (const Table *t, Counters *ct) {
  int lg;
  unsigned int ttlg;  /* 2^lg */
  unsigned int ause = 0;  /* summation of 'nums' */
  unsigned int i = 1;  /* index to traverse all array keys */
  unsigned int asize = t->asize;
  /* traverse each slice */
  for (lg = 0, ttlg = 1; lg <= MAXABITS; lg++, ttlg *= 2) {
    unsigned int lc = 0;  /* counter */
    unsigned int lim = ttlg;
    if (lim > asize) {
      lim = asize;  /* adjust upper limit */
      if (i > lim)
        break;  /* no more elements to count */
    }
    /* count elements in range (2^(lg - 1), 2^lg] */
    for (; i <= lim; i++) {
      if (!arraykeyisempty(t, i))
        lc++;
    }
    ct->nums[lg] += lc;
    ause += lc;
  }
  ct->total += ause;
  ct->na += ause;
}